

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableValue.cpp
# Opt level: O0

void __thiscall
VariableValue::VariableValue(VariableValue *this,PrimitiveSimpleObject *type,int value)

{
  bool bVar1;
  runtime_error *this_00;
  int value_local;
  PrimitiveSimpleObject *type_local;
  VariableValue *this_local;
  
  Value::Value(&this->super_Value);
  (this->super_Value)._vptr_Value = (_func_int **)&PTR_SetValue_001d96f8;
  this->type_ = type;
  this->value_ = 0;
  std::
  unordered_map<Symbol,_Value_*,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_Value_*>_>_>
  ::unordered_map(&this->fields_);
  bVar1 = PrimitiveSimpleObject::IsClass(this->type_);
  if (!bVar1) {
    this->value_ = value;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Trying to set \'int\' value to Class object");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

VariableValue::VariableValue(PrimitiveSimpleObject* type, int value)
    : type_(type) {
  if (type_->IsClass()) {
    throw std::runtime_error("Trying to set 'int' value to Class object");
  } else {
    value_ = value;
  }
}